

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_utils.cpp
# Opt level: O0

void HydroUtils::EB_ComputeFluxes
               (Box *bx,Array4<double> *fx,Array4<double> *fy,Array4<double> *fz,
               Array4<const_double> *umac,Array4<const_double> *vmac,Array4<const_double> *wmac,
               Array4<const_double> *xed,Array4<const_double> *yed,Array4<const_double> *zed,
               Array4<const_double> *apx,Array4<const_double> *apy,Array4<const_double> *apz,
               Geometry *geom,int ncomp,Array4<const_amrex::EBCellFlag> *flag,
               bool fluxes_are_area_weighted)

{
  void *in_RCX;
  void *in_RDX;
  void *in_RSI;
  undefined8 *in_RDI;
  void *in_R8;
  void *in_R9;
  void *in_stack_00000008;
  void *in_stack_00000010;
  void *in_stack_00000018;
  void *in_stack_00000020;
  void *in_stack_00000028;
  void *in_stack_00000030;
  void *in_stack_00000038;
  CoordSys *in_stack_00000040;
  void *in_stack_00000050;
  byte in_stack_00000058;
  Box bx_3;
  Box *zbx;
  Box bx_2;
  Box *ybx;
  Box bx_1;
  Box *xbx;
  GpuArray<double,_3U> area;
  GpuArray<double,_3U> dx;
  undefined1 local_6e0 [8];
  anon_class_344_6_f5a42a41 *in_stack_fffffffffffff928;
  int in_stack_fffffffffffff934;
  Box *in_stack_fffffffffffff938;
  undefined1 auStack_6a0 [64];
  undefined1 auStack_660 [64];
  undefined8 local_620;
  undefined8 local_618;
  undefined8 local_610;
  undefined1 auStack_608 [64];
  undefined1 auStack_5c8 [68];
  undefined8 local_584;
  undefined8 local_57c;
  undefined8 local_574;
  uint local_56c;
  undefined8 *local_568;
  undefined1 local_560 [64];
  undefined1 auStack_520 [64];
  undefined1 auStack_4e0 [64];
  undefined8 local_4a0;
  undefined8 local_498;
  undefined8 local_490;
  undefined1 auStack_488 [64];
  undefined1 auStack_448 [68];
  undefined8 local_404;
  undefined8 local_3fc;
  undefined8 local_3f4;
  uint local_3ec;
  undefined8 *local_3e8;
  undefined1 local_3e0 [64];
  undefined1 auStack_3a0 [64];
  undefined1 auStack_360 [64];
  undefined8 local_320;
  undefined8 local_318;
  undefined8 local_310;
  undefined1 auStack_308 [64];
  undefined1 auStack_2c8 [68];
  undefined8 local_284;
  undefined8 local_27c;
  undefined8 local_274;
  uint local_26c;
  undefined8 *local_268;
  undefined8 local_260;
  undefined8 local_258;
  undefined8 local_250;
  GpuArray<double,_3U> local_248;
  byte local_229;
  void *local_228;
  void *local_220;
  void *local_218;
  void *local_210;
  void *local_208;
  undefined8 *local_200;
  undefined4 local_1f4;
  GpuArray<double,_3U> *local_1f0;
  undefined4 local_1e4;
  GpuArray<double,_3U> *local_1e0;
  undefined4 local_1d4;
  GpuArray<double,_3U> *local_1d0;
  undefined4 local_1c4;
  GpuArray<double,_3U> *local_1c0;
  undefined4 local_1b4;
  GpuArray<double,_3U> *local_1b0;
  undefined4 local_1a4;
  GpuArray<double,_3U> *local_1a0;
  undefined4 local_194;
  undefined8 *local_190;
  undefined4 local_184;
  undefined8 *local_180;
  undefined4 local_174;
  undefined8 *local_170;
  undefined4 local_164;
  undefined8 *local_160;
  undefined4 local_154;
  undefined8 *local_150;
  undefined4 local_144;
  undefined8 *local_140;
  undefined4 local_134;
  undefined8 *local_130;
  undefined4 local_124;
  undefined8 *local_120;
  undefined4 local_114;
  undefined8 *local_110;
  undefined4 local_104;
  undefined8 *local_100;
  undefined4 local_f4;
  undefined8 *local_f0;
  undefined4 local_e4;
  undefined8 *local_e0;
  undefined4 local_d4;
  uint *local_d0;
  undefined4 local_c4;
  uint *local_c0;
  undefined4 local_b4;
  uint *local_b0;
  undefined4 local_a8;
  undefined4 local_a4;
  long local_a0;
  undefined4 local_98;
  undefined4 local_94;
  long local_90;
  undefined4 local_88;
  undefined4 local_84;
  long local_80;
  undefined4 local_74;
  uint *local_70;
  undefined4 local_64;
  uint *local_60;
  undefined4 local_54;
  uint *local_50;
  undefined4 local_44;
  uint *local_40;
  undefined4 local_34;
  uint *local_30;
  undefined4 local_24;
  uint *local_20;
  undefined4 local_18;
  undefined4 local_14;
  undefined4 local_10;
  undefined4 local_c;
  undefined4 local_8;
  undefined4 local_4;
  
  local_229 = in_stack_00000058 & 1;
  local_228 = in_R9;
  local_220 = in_R8;
  local_218 = in_RCX;
  local_210 = in_RDX;
  local_208 = in_RSI;
  local_200 = in_RDI;
  amrex::CoordSys::CellSizeArray(&local_248,in_stack_00000040);
  if ((local_229 & 1) == 0) {
    local_170 = &local_260;
    local_174 = 0;
    local_180 = &local_260;
    local_184 = 1;
    local_190 = &local_260;
    local_194 = 2;
  }
  else {
    local_1a0 = &local_248;
    local_1a4 = 1;
    local_1b0 = &local_248;
    local_1b4 = 2;
    local_140 = &local_260;
    local_144 = 0;
    local_1c0 = &local_248;
    local_1c4 = 0;
    local_1d0 = &local_248;
    local_1d4 = 2;
    local_150 = &local_260;
    local_154 = 1;
    local_1e0 = &local_248;
    local_1e4 = 0;
    local_1f0 = &local_248;
    local_1f4 = 1;
    local_160 = &local_260;
    local_164 = 2;
  }
  local_110 = local_200;
  local_114 = 0;
  local_284 = *local_200;
  local_27c = local_200[1];
  local_274 = local_200[2];
  local_26c = *(uint *)(local_200 + 3);
  local_100 = &local_284;
  local_104 = 0;
  local_b0 = &local_26c;
  local_b4 = 0;
  local_44 = 0;
  local_10 = 0;
  if ((local_26c & 1) == 0) {
    local_80 = (long)&local_27c + 4;
    local_84 = 0;
    local_88 = 1;
    local_50 = &local_26c;
    local_54 = 0;
    local_c = 0;
    local_26c = local_26c | 1;
  }
  local_268 = &local_284;
  local_40 = local_b0;
  memcpy(local_3e0,local_208,0x3c);
  memcpy(auStack_3a0,local_220,0x3c);
  memcpy(auStack_360,in_stack_00000010,0x3c);
  local_320 = local_260;
  local_318 = local_258;
  local_310 = local_250;
  memcpy(auStack_308,in_stack_00000028,0x3c);
  memcpy(auStack_2c8,in_stack_00000050,0x3c);
  amrex::
  ParallelFor<int,HydroUtils::EB_ComputeFluxes(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Geometry_const&,int,amrex::Array4<amrex::EBCellFlag_const>const&,bool)::__0,void>
            (in_stack_fffffffffffff938,in_stack_fffffffffffff934,in_stack_fffffffffffff928);
  local_120 = local_200;
  local_124 = 1;
  local_404 = *local_200;
  local_3fc = local_200[1];
  local_3f4 = local_200[2];
  local_3ec = *(uint *)(local_200 + 3);
  local_f0 = &local_404;
  local_f4 = 1;
  local_c0 = &local_3ec;
  local_c4 = 1;
  local_34 = 1;
  local_14 = 1;
  if ((local_3ec & 2) == 0) {
    local_90 = (long)&local_3fc + 4;
    local_94 = 1;
    local_98 = 1;
    local_60 = &local_3ec;
    local_64 = 1;
    local_8 = 1;
    local_3ec = local_3ec | 2;
  }
  local_3e8 = &local_404;
  local_30 = local_c0;
  memcpy(local_560,local_210,0x3c);
  memcpy(auStack_520,local_228,0x3c);
  memcpy(auStack_4e0,in_stack_00000018,0x3c);
  local_4a0 = local_260;
  local_498 = local_258;
  local_490 = local_250;
  memcpy(auStack_488,in_stack_00000030,0x3c);
  memcpy(auStack_448,in_stack_00000050,0x3c);
  amrex::
  ParallelFor<int,HydroUtils::EB_ComputeFluxes(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Geometry_const&,int,amrex::Array4<amrex::EBCellFlag_const>const&,bool)::__1,void>
            (in_stack_fffffffffffff938,in_stack_fffffffffffff934,
             (anon_class_344_6_60ef087d *)in_stack_fffffffffffff928);
  local_130 = local_200;
  local_134 = 2;
  local_584 = *local_200;
  local_57c = local_200[1];
  local_574 = local_200[2];
  local_56c = *(uint *)(local_200 + 3);
  local_e0 = &local_584;
  local_e4 = 2;
  local_d0 = &local_56c;
  local_d4 = 2;
  local_24 = 2;
  local_18 = 2;
  if ((local_56c & 4) == 0) {
    local_a0 = (long)&local_57c + 4;
    local_a4 = 2;
    local_a8 = 1;
    local_70 = &local_56c;
    local_74 = 2;
    local_4 = 2;
    local_56c = local_56c | 4;
  }
  local_568 = &local_584;
  local_20 = local_d0;
  memcpy(local_6e0,local_218,0x3c);
  memcpy(auStack_6a0,in_stack_00000008,0x3c);
  memcpy(auStack_660,in_stack_00000020,0x3c);
  local_620 = local_260;
  local_618 = local_258;
  local_610 = local_250;
  memcpy(auStack_608,in_stack_00000038,0x3c);
  memcpy(auStack_5c8,in_stack_00000050,0x3c);
  amrex::
  ParallelFor<int,HydroUtils::EB_ComputeFluxes(amrex::Box_const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Array4<double_const>const&,amrex::Geometry_const&,int,amrex::Array4<amrex::EBCellFlag_const>const&,bool)::__2,void>
            (in_stack_fffffffffffff938,in_stack_fffffffffffff934,
             (anon_class_344_6_cc39e6b9 *)in_stack_fffffffffffff928);
  return;
}

Assistant:

void
HydroUtils::EB_ComputeFluxes ( Box const& bx,
                               AMREX_D_DECL( Array4<Real> const& fx,
                                             Array4<Real> const& fy,
                                             Array4<Real> const& fz),
                               AMREX_D_DECL( Array4<Real const> const& umac,
                                             Array4<Real const> const& vmac,
                                             Array4<Real const> const& wmac),
                               AMREX_D_DECL( Array4<Real const> const& xed,
                                             Array4<Real const> const& yed,
                                             Array4<Real const> const& zed),
                               AMREX_D_DECL( Array4<Real const> const& apx,
                                             Array4<Real const> const& apy,
                                             Array4<Real const> const& apz),
                               Geometry const& geom, const int ncomp,
                               Array4<EBCellFlag const> const& flag,
                               const bool fluxes_are_area_weighted )
{

    const auto dx = geom.CellSizeArray();

    GpuArray<Real,AMREX_SPACEDIM> area;

#if ( AMREX_SPACEDIM == 3 )
    if (fluxes_are_area_weighted)
    {
        area[0] = dx[1]*dx[2];
        area[1] = dx[0]*dx[2];
        area[2] = dx[0]*dx[1];
    } else {
        area[0] = 1.; area[1] = 1.; area[2] = 1.;
    }
#else
    if (fluxes_are_area_weighted)
    {
        area[0] = dx[1];
        area[1] = dx[0];
    } else {
        area[0] = 1.; area[1] = 1.;
    }
#endif

    //
    //  X flux
    //
    const Box& xbx = amrex::surroundingNodes(bx,0);

    amrex::ParallelFor(xbx, ncomp, [fx, umac, xed, area, apx, flag]
    AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
    {
        if (flag(i,j,k).isConnected(-1,0,0))
            fx(i,j,k,n) = xed(i,j,k,n) * umac(i,j,k) * apx(i,j,k) * area[0];
        else
            fx(i,j,k,n) = 0.;
    });

    //
    //  y flux
    //
    const Box& ybx = amrex::surroundingNodes(bx,1);

    amrex::ParallelFor(ybx, ncomp, [fy, vmac, yed, area, apy, flag]
    AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
    {
        if (flag(i,j,k).isConnected(0,-1,0))
            fy(i,j,k,n) = yed(i,j,k,n) * vmac(i,j,k) * apy(i,j,k) * area[1];
        else
            fy(i,j,k,n) = 0.;
    });

#if (AMREX_SPACEDIM==3)
    //
    //  z flux
    //
    const Box& zbx = amrex::surroundingNodes(bx,2);

    amrex::ParallelFor(zbx, ncomp, [fz, wmac, zed, area, apz, flag]
    AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
    {
        if (flag(i,j,k).isConnected(0,0,-1))
            fz(i,j,k,n) = zed(i,j,k,n) * wmac(i,j,k) * apz(i,j,k) * area[2];
        else
            fz(i,j,k,n) = 0.;
    });
#endif

}